

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<DataStream,std::vector<uint256,std::allocator<uint256>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<uint256,_std::allocator<uint256>_> *v)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<DataStream>
            (s,(long)(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 5);
  puVar2 = (v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (v->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_start;
  while (puVar3 != puVar2) {
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
               (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_finish,puVar3,puVar3 + 1);
    puVar3 = puVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }